

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O3

void __thiscall
dnet::data_types::tensor<double,_2U>::tensor
          (tensor<double,_2U> *this,type *data,array<unsigned_int,_2UL> size)

{
  pointer pdVar1;
  output_type local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_28;
  
  tensor(this,size);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_28,data);
  vec_flater<double,_2U>::flatten(&local_48,&local_28);
  pdVar1 = (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

tensor<T, N>::tensor(typename vector_dim<T, N>::type data, std::array<index_type, N> size)
                : tensor(size)
        {
            this->_data = vec_flater<T, N>::flatten(data);
        }